

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

bool __thiscall cornerstone::raft_server::is_leader(raft_server *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  __node_base *p_Var4;
  bool bVar5;
  shared_lock<std::shared_timed_mutex> rlock;
  vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  peer_resp_times;
  shared_lock<std::shared_timed_mutex> local_48;
  _Vector_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  local_38;
  
  local_48._M_pm = &this->peers_lock_;
  local_48._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_48._M_pm)->super___shared_timed_mutex_base);
  if (this->role_ == leader) {
    bVar5 = true;
    if (((this->peers_)._M_h._M_element_count == 0) ||
       (is_leader::time_elasped_since_quorum_resp <=
        *(int *)(((this->ctx_)._M_t.
                  super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                  .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_)._M_t
                .
                super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
        * 2)) goto LAB_00140f1d;
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var4 = &(this->peers_)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      std::
      vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ::push_back((vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   *)&local_38,
                  (value_type *)
                  (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor
                  + 10));
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>*,std::vector<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_38._M_impl.super__Vector_impl_data._M_start,
               local_38._M_impl.super__Vector_impl_data._M_finish);
    lVar3 = std::chrono::_V2::system_clock::now();
    iVar2 = (int)((lVar3 - *(long *)((long)&((local_38._M_impl.super__Vector_impl_data._M_start)->
                                            __d).__r +
                                    ((this->peers_)._M_h._M_element_count & 0xfffffffffffffffe) * 4)
                  ) / 1000000);
    iVar1 = *(int *)(((this->ctx_)._M_t.
                      super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                      .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_).
                    _M_t.
                    super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
    ;
    is_leader::time_elasped_since_quorum_resp = iVar2;
    std::
    _Vector_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
    ::~_Vector_base(&local_38);
    if (iVar2 <= iVar1 * 2) {
      bVar5 = this->role_ == leader;
      goto LAB_00140f1d;
    }
  }
  bVar5 = false;
LAB_00140f1d:
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_48);
  return bVar5;
}

Assistant:

bool raft_server::is_leader() const
{
    static volatile int32 time_elasped_since_quorum_resp(std::numeric_limits<int32>::max());
    read_lock(peers_lock_);
    if (role_ == srv_role::leader && peers_.size() > 0 &&
        time_elasped_since_quorum_resp > ctx_->params_->election_timeout_upper_bound_ * 2)
    {
        std::vector<time_point> peer_resp_times;
        for (auto& peer : peers_)
        {
            peer_resp_times.push_back(peer.second->get_last_resp());
        }

        std::sort(peer_resp_times.begin(), peer_resp_times.end());
        time_elasped_since_quorum_resp =
            static_cast<int32>(std::chrono::duration_cast<std::chrono::milliseconds>(
                                   system_clock::now() - peer_resp_times[peers_.size() / 2])
                                   .count());
        if (time_elasped_since_quorum_resp > ctx_->params_->election_timeout_upper_bound_ * 2)
        {
            return false;
        }
    }

    return role_ == srv_role::leader;
}